

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LowpassSpeaker.hpp
# Opt level: O1

void __thiscall
Outputs::Speaker::PullLowpass<Atari2600::TIASound>::~PullLowpass
          (PullLowpass<Atari2600::TIASound> *this)

{
  FIRFilter *__ptr;
  pointer psVar1;
  
  (this->super_LowpassBase<Outputs::Speaker::PullLowpass<Atari2600::TIASound>,_false>).super_Speaker
  ._vptr_Speaker = (_func_int **)&PTR__LowpassBase_0059d440;
  __ptr = (this->super_LowpassBase<Outputs::Speaker::PullLowpass<Atari2600::TIASound>,_false>).
          filter_._M_t.
          super___uniq_ptr_impl<SignalProcessing::FIRFilter,_std::default_delete<SignalProcessing::FIRFilter>_>
          ._M_t.
          super__Tuple_impl<0UL,_SignalProcessing::FIRFilter_*,_std::default_delete<SignalProcessing::FIRFilter>_>
          .super__Head_base<0UL,_SignalProcessing::FIRFilter_*,_false>._M_head_impl;
  if (__ptr != (FIRFilter *)0x0) {
    std::default_delete<SignalProcessing::FIRFilter>::operator()
              ((default_delete<SignalProcessing::FIRFilter> *)
               &(this->super_LowpassBase<Outputs::Speaker::PullLowpass<Atari2600::TIASound>,_false>)
                .filter_,__ptr);
  }
  (this->super_LowpassBase<Outputs::Speaker::PullLowpass<Atari2600::TIASound>,_false>).filter_._M_t.
  super___uniq_ptr_impl<SignalProcessing::FIRFilter,_std::default_delete<SignalProcessing::FIRFilter>_>
  ._M_t.
  super__Tuple_impl<0UL,_SignalProcessing::FIRFilter_*,_std::default_delete<SignalProcessing::FIRFilter>_>
  .super__Head_base<0UL,_SignalProcessing::FIRFilter_*,_false>._M_head_impl = (FIRFilter *)0x0;
  psVar1 = (this->super_LowpassBase<Outputs::Speaker::PullLowpass<Atari2600::TIASound>,_false>).
           output_buffer_.super__Vector_base<short,_std::allocator<short>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (psVar1 != (pointer)0x0) {
    operator_delete(psVar1,(long)(this->
                                 super_LowpassBase<Outputs::Speaker::PullLowpass<Atari2600::TIASound>,_false>
                                 ).output_buffer_.super__Vector_base<short,_std::allocator<short>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage - (long)psVar1);
  }
  psVar1 = (this->super_LowpassBase<Outputs::Speaker::PullLowpass<Atari2600::TIASound>,_false>).
           input_buffer_.super__Vector_base<short,_std::allocator<short>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (psVar1 != (pointer)0x0) {
    operator_delete(psVar1,(long)(this->
                                 super_LowpassBase<Outputs::Speaker::PullLowpass<Atari2600::TIASound>,_false>
                                 ).input_buffer_.super__Vector_base<short,_std::allocator<short>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage - (long)psVar1);
  }
  (this->super_LowpassBase<Outputs::Speaker::PullLowpass<Atari2600::TIASound>,_false>).super_Speaker
  ._vptr_Speaker = (_func_int **)&PTR__Speaker_00593c18;
  psVar1 = (this->super_LowpassBase<Outputs::Speaker::PullLowpass<Atari2600::TIASound>,_false>).
           super_Speaker.mix_buffer_.super__Vector_base<short,_std::allocator<short>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (psVar1 != (pointer)0x0) {
    operator_delete(psVar1,(long)(this->
                                 super_LowpassBase<Outputs::Speaker::PullLowpass<Atari2600::TIASound>,_false>
                                 ).super_Speaker.mix_buffer_.
                                 super__Vector_base<short,_std::allocator<short>_>._M_impl.
                                 super__Vector_impl_data._M_end_of_storage - (long)psVar1);
  }
  operator_delete(this,0xd8);
  return;
}

Assistant:

PullLowpass(SampleSource &sample_source) : sample_source_(sample_source) {
			// Propagate an initial volume level.
			sample_source.set_sample_volume_range(32767);
		}